

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_dist.hpp
# Opt level: O1

void __thiscall
trng::discrete_dist::param_type::update_layer(param_type *this,size_type layer,size_type n)

{
  pointer pdVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  
  uVar2 = -1L << ((byte)layer & 0x3f);
  uVar3 = ~uVar2;
  uVar4 = n + uVar3;
  if (uVar3 < uVar4) {
    pdVar1 = (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = -uVar2;
    do {
      dVar5 = pdVar1[uVar2 - 1];
      if (uVar2 < uVar4) {
        dVar5 = dVar5 + pdVar1[uVar2];
      }
      *(double *)((long)pdVar1 + (uVar2 * 4 - 8 & 0xfffffffffffffff8)) = dVar5;
      uVar3 = uVar2 + 1;
      uVar2 = uVar2 + 2;
    } while (uVar3 < uVar4);
  }
  return;
}

Assistant:

void update_layer(size_type layer, size_type n) {
        const size_type first{int_math::pow2(layer) - 1}, last{first + n};
        for (size_type i{first}; i < last; ++i, ++i)
          if (i + 1 < last)
            P_[(i - 1) / 2] = P_[i] + P_[i + 1];
          else
            P_[(i - 1) / 2] = P_[i];
      }